

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorShaderInstancer::DecoratorShaderInstancer(DecoratorShaderInstancer *this)

{
  EffectSpecification *this_00;
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorShaderInstancer_00396fe8;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"value",&local_99);
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"string",&local_9a);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9b);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).value = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"decorator",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"value",(allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand(this_00,&local_78,&local_98,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

DecoratorShaderInstancer::DecoratorShaderInstancer()
{
	ids.value = RegisterProperty("value", String()).AddParser("string").GetId();
	RegisterShorthand("decorator", "value", ShorthandType::FallThrough);
}